

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

int sprint_dns_header(char *dest,char *src)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  bool bVar6;
  ushort uVar7;
  int iVar8;
  int iVar9;
  size_t sVar10;
  char *pcVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  char *pcVar16;
  char *pcVar17;
  uint uVar18;
  char *pcVar19;
  char *pcVar20;
  char *pcVar21;
  char *pcVar22;
  ushort uVar23;
  char *pcVar24;
  short local_98;
  short local_88;
  ushort local_68;
  short local_60;
  
  uVar1 = *(ushort *)(src + 4);
  uVar23 = *(ushort *)src << 8 | *(ushort *)src >> 8;
  uVar2 = *(ushort *)(src + 2);
  uVar3 = *(ushort *)(src + 6);
  uVar4 = *(ushort *)(src + 8);
  uVar5 = *(ushort *)(src + 10);
  uVar7 = uVar2 << 8 | uVar2 >> 8;
  uVar18 = uVar2 >> 3 & 0xf;
  bit_to_str_b[0] = 0;
  if ((char)uVar2 < '\0') {
    uVar12 = 8;
    do {
      sVar10 = strlen(bit_to_str_b);
      *(ushort *)(bit_to_str_b + sVar10) = ((uVar12 & ~uVar18) == 0) + 0x30;
      bVar6 = 1 < uVar12;
      uVar12 = uVar12 >> 1;
    } while (bVar6);
    uVar12 = uVar2 >> 2 & 1;
    uVar13 = uVar2 >> 1 & 1;
    local_68 = uVar2 >> 0xe & 1;
    uVar14 = uVar2 >> 0xd & 1;
    uVar15 = uVar2 >> 0xc & 1;
    bit_to_str_b[0] = 0;
    uVar18 = 8;
    do {
      sVar10 = strlen(bit_to_str_b);
      *(ushort *)(bit_to_str_b + sVar10) = ((uVar18 & ~(uVar2 >> 8 & 0xf)) == 0) + 0x30;
      bVar6 = 1 < uVar18;
      uVar18 = uVar18 >> 1;
    } while (bVar6);
    pcVar16 = "Unknow";
    if ((uVar2 >> 3 & 0xf) == 1) {
      pcVar16 = "Reverse query (1)";
    }
    pcVar11 = "Standard query (0)";
    if ((uVar2 >> 3 & 0xf) != 0) {
      pcVar11 = pcVar16;
    }
    local_98 = (short)uVar12;
    pcVar16 = "Server is an authority for domain";
    if (local_98 == 0) {
      pcVar16 = "Server is not an authority for domain";
    }
    local_88 = (short)uVar13;
    pcVar22 = "Message is truncated";
    if (local_88 == 0) {
      pcVar22 = "Message is not truncated";
    }
    local_60 = (short)(uVar2 & 1);
    pcVar21 = "Do query recursively";
    pcVar19 = "Do query recursively";
    if (local_60 == 0) {
      pcVar19 = "Can\'t do recursively";
    }
    if (-1 < (short)uVar2) {
      pcVar21 = "Can\'t do recursively";
    }
    pcVar17 = "Answer/authority portion was authenticated by the server";
    if ((short)uVar14 == 0) {
      pcVar17 = "Answer/authority portion was not authenticated by the server";
    }
    pcVar24 = "Authenticated data";
    if ((short)uVar15 == 0) {
      pcVar24 = "Non-authenticated data";
    }
    uVar18 = uVar2 >> 8 & 0xf;
    if ((ushort)uVar18 < 6) {
      pcVar20 = &DAT_00107198 + *(int *)(&DAT_00107198 + (ulong)uVar18 * 4);
    }
    else {
      pcVar20 = "Unknow Eansweror";
    }
    iVar8 = sprintf(dest,
                    "------------------------------------\nTransaction ID: 0x%2x\nFLAG: 0x%04x\n%d... .... .... .... = Response:%s\n.%s... .... .... = Opcode: %s\n.... .%d.. .... .... = Authoritative: %s\n.... ..%d. .... .... = Truncated: %s\n.... ...%d .... .... = Recursion desired: %s\n.... .... %d... .... = Recursion available: %s\n.... .... .%d.. .... = Z: reserved (0)\n.... .... ..%d. .... = Answer authenticated: %s\n.... .... ..%d .... = %s\n.... .... .... %s = Reply code: %s\n"
                    ,(ulong)uVar23,uVar7,1,"Message is a response",bit_to_str_b,pcVar11,
                    (ulong)uVar12,pcVar16,(ulong)uVar13,pcVar22,(ulong)(uVar2 & 1),pcVar19,
                    uVar2 >> 0xf,pcVar21,(ulong)local_68,(ulong)uVar14,pcVar17,(ulong)uVar15,pcVar24
                    ,bit_to_str_b,pcVar20);
  }
  else {
    uVar12 = 8;
    do {
      sVar10 = strlen(bit_to_str_b);
      *(ushort *)(bit_to_str_b + sVar10) = ((uVar12 & ~uVar18) == 0) + 0x30;
      bVar6 = 1 < uVar12;
      uVar12 = uVar12 >> 1;
    } while (bVar6);
    pcVar16 = "Unknow";
    if ((short)uVar18 == 1) {
      pcVar16 = "Reverse query (1)";
    }
    pcVar11 = "Standard query (0)";
    if ((uVar2 >> 3 & 0xf) != 0) {
      pcVar11 = pcVar16;
    }
    pcVar16 = "Message is truncated";
    if ((uVar2 >> 1 & 1) == 0) {
      pcVar16 = "Message is not truncated";
    }
    pcVar22 = "Do query recursively";
    if ((uVar2 & 1) == 0) {
      pcVar22 = "Can\'t do recursively";
    }
    pcVar19 = "Authenticated data";
    if ((uVar2 >> 0xc & 1) == 0) {
      pcVar19 = "Non-authenticated data";
    }
    iVar8 = sprintf(dest,
                    "------------------------------------\nTransaction ID: 0x%2x\nFLAG: 0x%04x\n%d... .... .... .... = Response:%s\n.%s... .... ....  = Opcode: %s\n.... ..%d. .... .... = Truncated: %s\n.... ...%d .... .... = Recursion desired: %s\n.... .... .%d.. .... = Z: reserved (0)\n.... .... ...%d .... = %s\n"
                    ,uVar23,uVar7,0,"Message is a query",bit_to_str_b,pcVar11,
                    (ulong)(uVar2 >> 1 & 1),pcVar16,(ulong)(uVar2 & 1),pcVar22,
                    (ulong)(uVar2 >> 0xe & 1),(ulong)(uVar2 >> 0xc & 1),pcVar19);
  }
  iVar9 = sprintf(dest + iVar8,
                  "Questions: %d\nAnswer answers: %d \nAuthority answers: %d\nAdditional answers: %d\n"
                  ,(ulong)(ushort)(uVar1 << 8 | uVar1 >> 8),(ulong)(ushort)(uVar3 << 8 | uVar3 >> 8)
                  ,(ulong)(ushort)(uVar4 << 8 | uVar4 >> 8),(ulong)(ushort)(uVar5 << 8 | uVar5 >> 8)
                 );
  return iVar9 + iVar8;
}

Assistant:

int sprint_dns_header(char *dest, char *src) {
  struct dns_header header;
  read_dns_header(&header, src);
  int size = 0;
  if (!header.qr) {
    //询问
    size += sprintf(dest, "------------------------------------\n\
Transaction ID: 0x%2x\n\
FLAG: 0x%04x\n\\
%d... .... .... .... = Response:%s\n\
.%s... .... ....  = Opcode: %s\n\
.... ..%d. .... .... = Truncated: %s\n\
.... ...%d .... .... = Recursion desired: %s\n\
.... .... .%d.. .... = Z: reserved (0)\n\
.... .... ...%d .... = %s\n",
                    header.id,
                    ntohs(header.flags), //为了打印需要
                    0, debugstr(DEBUG_PRINT_TYPE_qr, header.qr),
                    bit_to_str(header.opcode, 4),
                    debugstr(DEBUG_PRINT_TYPE_opcode, header.opcode), header.tc,
                    debugstr(DEBUG_PRINT_TYPE_tc, header.tc), header.rd,
                    debugstr(DEBUG_PRINT_TYPE_rd, header.rd), header.z,
                    header.cd, debugstr(DEBUG_PRINT_TYPE_cd, header.cd));
  } else {
    //回答
    size += sprintf(
        dest, "------------------------------------\n\
Transaction ID: 0x%2x\n\
FLAG: 0x%04x\n\
%d... .... .... .... = Response:%s\n\
.%s... .... .... = Opcode: %s\n\
.... .%d.. .... .... = Authoritative: %s\n\
.... ..%d. .... .... = Truncated: %s\n\
.... ...%d .... .... = Recursion desired: %s\n\
.... .... %d... .... = Recursion available: %s\n\
.... .... .%d.. .... = Z: reserved (0)\n\
.... .... ..%d. .... = Answer authenticated: %s\n\
.... .... ..%d .... = %s\n\
.... .... .... %s = Reply code: %s\n",
        header.id,
        ntohs(header.flags), ////为了打印需要
        1, debugstr(DEBUG_PRINT_TYPE_qr, 1), bit_to_str(header.opcode, 4),
        debugstr(DEBUG_PRINT_TYPE_opcode, header.opcode), header.aa,
        debugstr(DEBUG_PRINT_TYPE_aa, header.aa), header.tc,
        debugstr(DEBUG_PRINT_TYPE_tc, header.tc), header.rd,
        debugstr(DEBUG_PRINT_TYPE_rd, header.rd), header.ra,
        debugstr(DEBUG_PRINT_TYPE_ra, header.ra), header.z, header.ad,
        debugstr(DEBUG_PRINT_TYPE_ad, header.ad), header.cd,
        debugstr(DEBUG_PRINT_TYPE_cd, header.cd), bit_to_str(header.rcode, 4),
        debugstr(DEBUG_PRINT_TYPE_rcode, header.rcode));
  }
  dest += size;
  size +=
      sprintf(dest, "Questions: %d\n\
Answer answers: %d \n\
Authority answers: %d\n\
Additional answers: %d\n",
              header.qdcount, header.ancount, header.nscount, header.adcount);
  return size;
}